

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_ev.c
# Opt level: O2

CURLMcode Curl_multi_ev_assess_xfer_bset(Curl_multi *multi,uint_bset *set)

{
  _Bool _Var1;
  CURLMcode CVar2;
  undefined8 in_RAX;
  Curl_easy *data;
  uint mid;
  undefined8 uStack_28;
  
  if (((multi != (Curl_multi *)0x0) && (multi->socket_cb != (curl_socket_callback)0x0)) &&
     (uStack_28 = in_RAX, _Var1 = Curl_uint_bset_first(set,(uint *)((long)&uStack_28 + 4)), _Var1))
  {
    do {
      data = Curl_multi_get_easy(multi,uStack_28._4_4_);
      if ((data != (Curl_easy *)0x0) &&
         (CVar2 = Curl_multi_ev_assess_xfer(multi,data), CVar2 != CURLM_OK)) {
        return CVar2;
      }
      _Var1 = Curl_uint_bset_next(set,uStack_28._4_4_,(uint *)((long)&uStack_28 + 4));
    } while (_Var1);
  }
  return CURLM_OK;
}

Assistant:

CURLMcode Curl_multi_ev_assess_xfer_bset(struct Curl_multi *multi,
                                         struct uint_bset *set)
{
  unsigned int mid;
  CURLMcode result = CURLM_OK;

  if(multi && multi->socket_cb && Curl_uint_bset_first(set, &mid)) {
    do {
      struct Curl_easy *data = Curl_multi_get_easy(multi, mid);
      if(data)
        result = Curl_multi_ev_assess_xfer(multi, data);
    }
    while(!result && Curl_uint_bset_next(set, mid, &mid));
  }
  return result;
}